

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_> *
__thiscall
testing::Truly<(anonymous_namespace)::first_elements_are>
          (PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
           *__return_storage_ptr__,testing *this,first_elements_are pred)

{
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  *extraout_RAX;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  *extraout_RAX_00;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  *extraout_RAX_01;
  PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
  *pPVar1;
  long in_RDX;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,this,this + in_RDX);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_38 + (long)local_40);
  (__return_storage_ptr__->impl_).predicate_.expected_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->impl_).predicate_.expected_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_58 + (long)local_60);
  pPVar1 = extraout_RAX;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
    pPVar1 = extraout_RAX_00;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
    pPVar1 = extraout_RAX_01;
  }
  return pPVar1;
}

Assistant:

inline PolymorphicMatcher<internal::TrulyMatcher<Predicate> >
Truly(Predicate pred) {
  return MakePolymorphicMatcher(internal::TrulyMatcher<Predicate>(pred));
}